

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  undefined8 ridx_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int *ridx_01;
  bool bVar5;
  bool bVar6;
  type_conflict5 tVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  long lVar9;
  long lVar10;
  int j_2;
  int *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  int *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  int32_t local_344;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_340;
  int *local_338;
  int *local_330;
  int j_1;
  ulong uStack_320;
  uint local_318 [2];
  uint auStack_310 [2];
  uint local_308 [2];
  int local_300;
  bool local_2fc;
  undefined8 local_2f8;
  int *local_2f0;
  int j;
  uint auStack_2e0 [2];
  uint local_2d8 [2];
  uint auStack_2d0 [2];
  uint local_2c8 [2];
  int local_2c0;
  bool local_2bc;
  undefined8 local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)eps2.m_backend.data._M_elems._0_8_;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_360 = eps;
  local_350 = vec;
  local_338 = idx;
  vSolveLright2(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8);
  local_358 = ridx;
  local_340 = this;
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    local_368 = (this->row).perm;
    _j_1 = _j_1 & 0xffffffff00000000;
    for (lVar9 = 0; lVar9 < rn; lVar9 = lVar9 + 1) {
      iVar2 = ridx[lVar9];
      local_228.m_backend.exp = rhs[iVar2].m_backend.exp;
      local_228.m_backend.neg = rhs[iVar2].m_backend.neg;
      local_228.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 8);
      local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_228.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_228.m_backend.fpclass = rhs[iVar2].m_backend.fpclass;
      local_228.m_backend.prec_elem = rhs[iVar2].m_backend.prec_elem;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_360->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 8);
      local_268.m_backend.exp = (local_360->m_backend).exp;
      local_268.m_backend.neg = (local_360->m_backend).neg;
      local_268.m_backend.fpclass = (local_360->m_backend).fpclass;
      local_268.m_backend.prec_elem = (local_360->m_backend).prec_elem;
      bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_228,&local_268);
      if (bVar6) {
        enQueueMax(ridx,&j_1,local_368[iVar2]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
      }
    }
    rn = j_1;
  }
  else {
    local_330 = (int *)eps2.m_backend._48_8_;
    local_2f0 = (this->row).perm;
    _j = _j & 0xffffffff00000000;
    for (lVar9 = 0; lVar9 < rn; lVar9 = lVar9 + 1) {
      iVar2 = ridx[lVar9];
      lVar10 = (long)iVar2;
      lVar8 = lVar10 * 0x38;
      local_308 = *(uint (*) [2])(rhs[lVar10].m_backend.data._M_elems + 8);
      _j_1 = *(ulong *)rhs[lVar10].m_backend.data._M_elems;
      uStack_320 = *(ulong *)(rhs[lVar10].m_backend.data._M_elems + 2);
      puVar1 = rhs[lVar10].m_backend.data._M_elems + 4;
      local_318 = *(uint (*) [2])puVar1;
      auStack_310 = *(uint (*) [2])(puVar1 + 2);
      local_2a8.m_backend.exp = rhs[lVar10].m_backend.exp;
      bVar6 = rhs[lVar10].m_backend.neg;
      fVar3 = rhs[lVar10].m_backend.fpclass;
      local_344 = rhs[lVar10].m_backend.prec_elem;
      local_2a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 8);
      local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar10].m_backend.data._M_elems;
      local_2a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[lVar10].m_backend.data._M_elems + 2);
      puVar1 = rhs[lVar10].m_backend.data._M_elems + 4;
      local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_368 = (int *)CONCAT44(local_368._4_4_,local_2a8.m_backend.exp);
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_360->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 6);
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_360->m_backend).data._M_elems + 8);
      local_1e8.m_backend.exp = (local_360->m_backend).exp;
      local_1e8.m_backend.neg = (local_360->m_backend).neg;
      local_1e8.m_backend.fpclass = (local_360->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (local_360->m_backend).prec_elem;
      local_2a8.m_backend.neg = bVar6;
      local_2a8.m_backend.fpclass = fVar3;
      local_2a8.m_backend.prec_elem = local_344;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2a8,&local_1e8);
      ridx = local_358;
      if (bVar5) {
        *local_330 = iVar2;
        local_330 = local_330 + 1;
        enQueueMax(local_358,&j,local_2f0[lVar10]);
        *(uint (*) [2])(eps2.m_backend.data._M_elems._32_8_ + 0x20 + lVar8) = local_308;
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x10 + lVar8);
        *(uint (*) [2])puVar1 = local_318;
        *(uint (*) [2])(puVar1 + 2) = auStack_310;
        *(ulong *)(eps2.m_backend.data._M_elems._32_8_ + lVar8) = _j_1;
        ((ulong *)(eps2.m_backend.data._M_elems._32_8_ + lVar8))[1] = uStack_320;
        *(undefined4 *)(eps2.m_backend.data._M_elems._32_8_ + 0x28 + lVar8) = local_368._0_4_;
        *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x2c + lVar8) = bVar6;
        *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x30 + lVar8) = fVar3;
        *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x34 + lVar8) = local_344;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[lVar10].m_backend,0);
        ridx = local_358;
      }
      b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)eps2.m_backend.data._M_elems._0_8_;
    }
    *(int *)eps2.m_backend._40_8_ = j;
    rn = j;
  }
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)local_340->thedim * 0.2) {
    local_368 = (local_340->row).perm;
    j_2 = 0;
    for (lVar9 = 0; lVar9 < (int)eps2.m_backend.data._M_elems[6]; lVar9 = lVar9 + 1) {
      lVar10 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar9 * 4);
      lVar8 = lVar10 * 0x38;
      local_308 = *(uint (*) [2])(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar8);
      _j_1 = *(ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar8);
      uStack_320 = ((ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar8))[1];
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar8);
      local_318 = *(uint (*) [2])puVar1;
      auStack_310 = *(uint (*) [2])(puVar1 + 2);
      local_300 = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar8);
      local_2fc = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar8);
      local_2f8 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar8);
      local_2c8 = *(uint (*) [2])((b->m_backend).data._M_elems + 8);
      _j = *(ulong *)(b->m_backend).data._M_elems;
      auStack_2e0 = *(uint (*) [2])((b->m_backend).data._M_elems + 2);
      local_2d8 = *(uint (*) [2])((b->m_backend).data._M_elems + 4);
      auStack_2d0 = *(uint (*) [2])((b->m_backend).data._M_elems + 6);
      local_2c0 = (b->m_backend).exp;
      local_2bc = (b->m_backend).neg;
      local_2b8._0_4_ = (b->m_backend).fpclass;
      local_2b8._4_4_ = (b->m_backend).prec_elem;
      if ((fpclass_type)local_2b8 != cpp_dec_float_finite || j != 0) {
        local_2bc = (bool)(local_2bc ^ 1);
      }
      tVar7 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&j);
      if (tVar7) {
LAB_0022535e:
        enQueueMax((int *)eps2.m_backend.data._M_elems._16_8_,&j_2,local_368[lVar10]);
      }
      else {
        tVar7 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&j_1,b);
        if (tVar7) goto LAB_0022535e;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar8 + eps2.m_backend.data._M_elems._8_8_),0);
      }
    }
    eps2.m_backend.data._M_elems[6] = j_2;
  }
  else {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_340->thedim + -1;
  }
  ridx_01 = local_338;
  this_00 = local_340;
  vec_00 = local_350;
  pnVar4 = local_360;
  ridx_00 = eps2.m_backend.data._M_elems._16_8_;
  local_e8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_360->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_360->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_360->m_backend).data._M_elems + 2)
  ;
  local_e8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_360->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_360->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (local_360->m_backend).exp;
  local_e8.m_backend.neg = (local_360->m_backend).neg;
  local_e8.m_backend.fpclass = (local_360->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (local_360->m_backend).prec_elem;
  rn = vSolveUright(local_340,local_350,local_338,rhs,local_358,rn,&local_e8);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(b->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (b->m_backend).exp;
  local_128.m_backend.neg = (b->m_backend).neg;
  local_128.m_backend.fpclass = (b->m_backend).fpclass;
  local_128.m_backend.prec_elem = (b->m_backend).prec_elem;
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)ridx_00,
                   eps2.m_backend.data._M_elems[6],&local_128);
  if ((this_00->l).updateType == 0) {
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2)
    ;
    local_168.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
    local_168.m_backend.exp = (pnVar4->m_backend).exp;
    local_168.m_backend.neg = (pnVar4->m_backend).neg;
    local_168.m_backend.fpclass = (pnVar4->m_backend).fpclass;
    local_168.m_backend.prec_elem = (pnVar4->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,ridx_01,rn,&local_168);
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(b->m_backend).data._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 2);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 4);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 6);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((b->m_backend).data._M_elems + 8);
    local_1a8.m_backend.exp = (b->m_backend).exp;
    local_1a8.m_backend.neg = (b->m_backend).neg;
    local_1a8.m_backend.fpclass = (b->m_backend).fpclass;
    local_1a8.m_backend.prec_elem = (b->m_backend).prec_elem;
    vSolveUpdateRightNoNZ(this_00,vec2,&local_1a8);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}